

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

HRESULT __thiscall
Js::ByteCodeBufferBuilder::AddFunction
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,ParseableFunctionInfo *function,
          SRCINFO *srcInfo,ByteCodeCache *cache)

{
  byte bVar1;
  ushort uVar2;
  Type value;
  NestedArray *pNVar3;
  code *pcVar4;
  SerializedFieldList SVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  LocalFunctionId LVar9;
  Attributes value_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 *puVar10;
  DeferredFunctionStub *deferredStubs;
  PrintOffsets *pPVar11;
  ScopeInfo *scopeInfo;
  BufferBuilder *value_01;
  FunctionInfo *this_00;
  BufferBuilderList *builder_00;
  ImmutableList<Js::BufferBuilder_*> *pIVar12;
  BufferBuilder *value_02;
  ParseableFunctionInfo *function_00;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  BufferBuilderList *pBVar16;
  SerializedFieldList SVar17;
  FunctionBody *pFVar18;
  ParseableFunctionInfo *pPVar19;
  uint32 local_5c;
  BufferBuilderList *pBStack_58;
  uint32 sourceDiff;
  FunctionBody *local_50;
  ParseableFunctionInfo *local_48;
  SerializedFieldList local_40;
  SerializedFieldList definedFields;
  
  local_40 = (SerializedFieldList)0x0;
  local_5c = 0;
  definedFields = (SerializedFieldList)this;
  uVar7 = ParseableFunctionInfo::StartOffset(function);
  bVar6 = TryConvertToUInt32((ulong)uVar7,&local_5c);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x8ce,"(0)","0");
    if (bVar6) {
      *puVar10 = 0;
      return -0x7ffdfdff;
    }
LAB_007b303d:
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  local_48 = function;
  if (function->m_lineNumber == 0) {
    SVar17 = (SerializedFieldList)0x0;
  }
  else {
    SVar17 = (SerializedFieldList)0x1000000000000;
    local_40 = (SerializedFieldList)0x1000000000000;
    PrependInt32((ByteCodeBufferBuilder *)definedFields,builder,L"Line Number",
                 function->m_lineNumber,(BufferBuilderInt32 **)0x0);
  }
  pBStack_58 = builder;
  if (local_48->m_columnNumber != 0) {
    SVar17 = (SerializedFieldList)((ulong)SVar17 | 0x2000000000000);
    local_40 = SVar17;
    PrependInt32((ByteCodeBufferBuilder *)definedFields,builder,L"Column Number",
                 local_48->m_columnNumber,(BufferBuilderInt32 **)0x0);
  }
  pPVar19 = local_48;
  iVar8 = (*(local_48->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[7])(local_48);
  uVar2 = *(ushort *)&(pPVar19->super_FunctionProxy).field_0x45;
  bVar1 = (pPVar19->super_FunctionProxy).field_0x47;
  uVar13 = (uint)uVar2;
  uVar14 = (uint)uVar2;
  uVar15 = (uint)bVar1;
  uVar15 = ((uVar14 & 0x600 | bVar1 & 1) << 9 | (uVar14 & 0x80) << 0x12) + (uVar15 & 8) * 2 |
           (uVar15 & 2) << 9 | (uVar15 & 0x20) << 0x13 |
           (uVar13 & 0x40) << 8 |
           (uVar13 & 0x20) << 0xc |
           (uVar2 >> 1 & 4 | uVar2 >> 2 & 1) + (uVar13 & 0x10) * 4 | bVar1 >> 1 & 2 |
           (uint)((char16 *)CONCAT44(extraout_var,iVar8) == L"Anonymous function") << 0x14 |
           uVar2 >> 9 & 8 | uVar2 >> 1 & 0x80 | uVar2 >> 5 & 0x100 | (uVar14 & 0x4000) << 8 |
           (uVar14 & 0x8000) << 6;
  bVar6 = FunctionProxy::IsFunctionBody(&pPVar19->super_FunctionProxy);
  if (bVar6) {
    local_50 = FunctionProxy::GetFunctionBody(&pPVar19->super_FunctionProxy);
    uVar13 = *(uint *)&local_50->field_0x178;
    uVar15 = uVar15 | (uVar13 >> 10 & 0x800) + (uVar13 & 8) * 4 | uVar13 >> 8 & 0x1000 |
                      uVar13 >> 0xb & 0x2000 | uVar13 >> 8 & 0x8000 | uVar13 >> 9 & 0x10000 |
                      uVar13 >> 3 & 0x800000;
  }
  else {
    local_50 = (FunctionBody *)0x0;
  }
  pBVar16 = pBStack_58;
  PrependConstantInt32
            ((ByteCodeBufferBuilder *)definedFields,pBStack_58,L"BitFlags",uVar15,
             (ConstantSizedBufferBuilderOf<int> **)0x0);
  pPVar19 = local_48;
  if ((char16 *)CONCAT44(extraout_var,iVar8) != L"Anonymous function") {
    iVar8 = (*(local_48->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])(local_48);
    PrependString16((ByteCodeBufferBuilder *)definedFields,pBVar16,L"Display Name",
                    (LPCWSTR)CONCAT44(extraout_var_00,iVar8),pPVar19->m_displayNameLength * 2 + 2);
  }
  LVar9 = FunctionProxy::GetLocalFunctionId(&pPVar19->super_FunctionProxy);
  PrependInt32((ByteCodeBufferBuilder *)definedFields,pBVar16,L"Relative Function ID",
               LVar9 - *(int *)((long)definedFields + 0x374),(BufferBuilderInt32 **)0x0);
  value_00 = FunctionProxy::GetAttributes(&pPVar19->super_FunctionProxy);
  if ((value_00 &
      ~(HomeObj|ComputedName|Method|BaseConstructorKind|AllowDirectSuper|CanDefer|
        EnclosedByGlobalFunc|Async|Generator|CapturesThis|Lambda|ClassConstructor|ClassMethod|
        SuperReference|DeferredParse|ErrorOnNew)) == None) {
    if (value_00 == None) goto LAB_007b2b1a;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x924,
                                "((attributes & ~(FunctionInfo::Attributes::ErrorOnNew | FunctionInfo::Attributes::SuperReference | FunctionInfo::Attributes::Lambda | FunctionInfo::Attributes::Async | FunctionInfo::Attributes::CapturesThis | FunctionInfo::Attributes::Generator | FunctionInfo::Attributes::ClassConstructor | FunctionInfo::Attributes::BaseConstructorKind | FunctionInfo::Attributes::ClassMethod | FunctionInfo::Attributes::Method | FunctionInfo::Attributes::EnclosedByGlobalFunc | FunctionInfo::Attributes::AllowDirectSuper | FunctionInfo::Attributes::DeferredParse | FunctionInfo::Attributes::CanDefer | FunctionInfo::Attributes::ComputedName | FunctionInfo::Attributes::HomeObj)) == 0)"
                                ,
                                "Only the ErrorOnNew|SuperReference|Lambda|CapturesThis|Generator|ClassConstructor|BaseConstructorKind|Async|ClassMember|Method|EnclosedByGlobalFunc|AllowDirectSuper|ComputedName|DeferredParse|CanDefer|HomeObj attributes should be set on a serialized function"
                               );
    if (!bVar6) goto LAB_007b303d;
    *puVar10 = 0;
  }
  SVar17 = (SerializedFieldList)((ulong)SVar17 | 0x4000000000000);
  local_40 = SVar17;
  PrependInt32((ByteCodeBufferBuilder *)definedFields,pBVar16,L"Attributes",value_00,
               (BufferBuilderInt32 **)0x0);
LAB_007b2b1a:
  SVar5 = definedFields;
  PrependInt32((ByteCodeBufferBuilder *)definedFields,pBVar16,L"Offset Into Source",local_5c,
               (BufferBuilderInt32 **)0x0);
  pPVar19 = local_48;
  uVar7 = ParseableFunctionInfo::PrintableStartOffset(local_48);
  PrependInt32((ByteCodeBufferBuilder *)SVar5,pBVar16,L"Offset Into Source for toString",uVar7,
               (BufferBuilderInt32 **)0x0);
  pNVar3 = (pPVar19->nestedArray).ptr;
  if ((pNVar3 != (NestedArray *)0x0) && (value = pNVar3->nestedCount, value != 0)) {
    SVar17 = (SerializedFieldList)((ulong)SVar17 | 0x8000000000000);
    local_40 = SVar17;
    PrependInt32((ByteCodeBufferBuilder *)definedFields,pBVar16,L"Nested count",value,
                 (BufferBuilderInt32 **)0x0);
  }
  deferredStubs =
       FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)0,DeferredFunctionStub*>
                 (&local_48->super_FunctionProxy);
  if (((value_00 & DeferredParse) != None && deferredStubs != (DeferredFunctionStub *)0x0) &&
     ((*(byte *)((long)definedFields + 0x390) & 4) != 0)) {
    SVar17 = (SerializedFieldList)((ulong)SVar17 | 0x800000000000000);
    pNVar3 = (local_48->nestedArray).ptr;
    if (pNVar3 == (NestedArray *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = pNVar3->nestedCount;
    }
    local_40 = SVar17;
    AddDeferredStubs((ByteCodeBufferBuilder *)definedFields,pBVar16,deferredStubs,uVar7,cache,true);
  }
  pPVar11 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)28,Js::PrintOffsets*>
                      (&local_48->super_FunctionProxy);
  SVar5 = definedFields;
  if (pPVar11 != (PrintOffsets *)0x0) {
    SVar17 = (SerializedFieldList)((ulong)SVar17 | 0x2000000000000000);
    local_40 = SVar17;
    PrependInt32((ByteCodeBufferBuilder *)definedFields,pBVar16,L"Start print offset",
                 pPVar11->cbStartPrintOffset,(BufferBuilderInt32 **)0x0);
    PrependInt32((ByteCodeBufferBuilder *)SVar5,pBVar16,L"End print offset",
                 pPVar11->cbEndPrintOffset,(BufferBuilderInt32 **)0x0);
  }
  scopeInfo = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)20,Js::ScopeInfo*>
                        (&local_48->super_FunctionProxy);
  if ((value_00 & (CanDefer|DeferredParse)) != None && scopeInfo != (ScopeInfo *)0x0) {
    SVar17 = (SerializedFieldList)((ulong)SVar17 | 0x1000000000000000);
    local_40 = SVar17;
    AddScopeInfo((ByteCodeBufferBuilder *)definedFields,pBVar16,scopeInfo);
  }
  pPVar19 = local_48;
  if (local_48->flags != Flags_None) {
    SVar17 = (SerializedFieldList)((ulong)SVar17 | 1);
    local_40 = SVar17;
    PrependByte((ByteCodeBufferBuilder *)definedFields,pBVar16,L"flags",local_48->flags);
  }
  if (pPVar19->m_grfscr != 0) {
    SVar17 = (SerializedFieldList)((ulong)SVar17 | 2);
    local_40 = SVar17;
    PrependInt32((ByteCodeBufferBuilder *)definedFields,pBVar16,L"m_grfscr",pPVar19->m_grfscr,
                 (BufferBuilderInt32 **)0x0);
  }
  if (pPVar19->m_inParamCount != 0) {
    SVar17 = (SerializedFieldList)((ulong)SVar17 | 4);
    local_40 = SVar17;
    PrependInt16((ByteCodeBufferBuilder *)definedFields,pBVar16,L"m_inParamCount",
                 pPVar19->m_inParamCount,(BufferBuilderInt16 **)0x0);
  }
  if (pPVar19->m_reportedInParamCount != 0) {
    SVar17 = (SerializedFieldList)((ulong)SVar17 | 8);
    local_40 = SVar17;
    PrependInt16((ByteCodeBufferBuilder *)definedFields,pBVar16,L"m_reportedInParamCount",
                 pPVar19->m_reportedInParamCount,(BufferBuilderInt16 **)0x0);
  }
  if (pPVar19->m_cchStartOffset != 0) {
    SVar17 = (SerializedFieldList)((ulong)SVar17 | 0x10);
    local_40 = SVar17;
    PrependInt32((ByteCodeBufferBuilder *)definedFields,pBVar16,L"m_cchStartOffset",
                 pPVar19->m_cchStartOffset,(BufferBuilderInt32 **)0x0);
  }
  if (pPVar19->m_cchLength != 0) {
    SVar17 = (SerializedFieldList)((ulong)SVar17 | 0x20);
    local_40 = SVar17;
    PrependInt32((ByteCodeBufferBuilder *)definedFields,pBVar16,L"m_cchLength",pPVar19->m_cchLength,
                 (BufferBuilderInt32 **)0x0);
  }
  if (pPVar19->m_cbLength != 0) {
    SVar17 = (SerializedFieldList)((ulong)SVar17 | 0x40);
    local_40 = SVar17;
    PrependInt32((ByteCodeBufferBuilder *)definedFields,pBVar16,L"m_cbLength",pPVar19->m_cbLength,
                 (BufferBuilderInt32 **)0x0);
  }
  if (pPVar19->m_displayShortNameOffset != 0) {
    SVar17 = (SerializedFieldList)((ulong)SVar17 | 0x80);
    local_40 = SVar17;
    PrependInt32((ByteCodeBufferBuilder *)definedFields,pBVar16,L"m_displayShortNameOffset",
                 pPVar19->m_displayShortNameOffset,(BufferBuilderInt32 **)0x0);
  }
  if (pPVar19->scopeSlotArraySize != 0) {
    SVar17 = (SerializedFieldList)((ulong)SVar17 | 0x100);
    local_40 = SVar17;
    PrependInt32((ByteCodeBufferBuilder *)definedFields,pBVar16,L"scopeSlotArraySize",
                 pPVar19->scopeSlotArraySize,(BufferBuilderInt32 **)0x0);
  }
  if (pPVar19->paramScopeSlotArraySize != 0) {
    local_40 = (SerializedFieldList)((ulong)SVar17 | 0x200);
    PrependInt32((ByteCodeBufferBuilder *)definedFields,pBVar16,L"paramScopeSlotArraySize",
                 pPVar19->paramScopeSlotArraySize,(BufferBuilderInt32 **)0x0);
  }
  AddPropertyIdsForScopeSlotArray((ByteCodeBufferBuilder *)definedFields,pBVar16,pPVar19);
  if (local_50 != (FunctionBody *)0x0) {
    AddFunctionBody((ByteCodeBufferBuilder *)definedFields,pBVar16,local_50,srcInfo,&local_40);
  }
  pNVar3 = (pPVar19->nestedArray).ptr;
  if ((pNVar3 != (NestedArray *)0x0) && (pNVar3->nestedCount != 0)) {
    pFVar18 = (FunctionBody *)0x0;
    value_01 = (BufferBuilder *)
               new<Memory::ArenaAllocator>
                         (0x20,*(ArenaAllocator **)((long)definedFields + 0x358),0x35916e);
    value_01->clue = L"Nest Function Bodies";
    value_01->offset = 0xffffffff;
    value_01->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a328;
    value_01[1]._vptr_BufferBuilder = (_func_int **)0x0;
    while( true ) {
      pBVar16 = pBStack_58;
      pNVar3 = (pPVar19->nestedArray).ptr;
      uVar15 = 0;
      if (pNVar3 != (NestedArray *)0x0) {
        uVar15 = pNVar3->nestedCount;
      }
      if (uVar15 <= (uint)pFVar18) break;
      this_00 = ParseableFunctionInfo::GetNestedFunc(pPVar19,(uint)pFVar18);
      SVar17 = definedFields;
      if (((this_00 == (FunctionInfo *)0x0) ||
          ((this_00->functionBodyImpl).ptr == (FunctionProxy *)0x0)) ||
         ((this_00->attributes & DeferredDeserialize) != None)) {
        PrependConstantInt32
                  ((ByteCodeBufferBuilder *)definedFields,pBStack_58,L"Empty Nested Function",0,
                   (ConstantSizedBufferBuilderOf<int> **)0x0);
      }
      else {
        builder_00 = (BufferBuilderList *)
                     new<Memory::ArenaAllocator>
                               (0x20,*(ArenaAllocator **)((long)definedFields + 0x358),0x35916e);
        (builder_00->super_BufferBuilder).clue = L"Nested Function";
        (builder_00->super_BufferBuilder).offset = 0xffffffff;
        (builder_00->super_BufferBuilder)._vptr_BufferBuilder =
             (_func_int **)&PTR_FixOffset_0137a328;
        builder_00->list = (ImmutableList<Js::BufferBuilder_*> *)0x0;
        local_50 = pFVar18;
        pIVar12 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                            ((ImmutableList<Js::BufferBuilder_*> *)value_01[1]._vptr_BufferBuilder,
                             (BufferBuilder *)builder_00,*(ArenaAllocator **)((long)SVar17 + 0x358))
        ;
        value_01[1]._vptr_BufferBuilder = (_func_int **)pIVar12;
        value_02 = (BufferBuilder *)
                   new<Memory::ArenaAllocator>
                             (0x28,*(ArenaAllocator **)((long)SVar17 + 0x358),0x35916e);
        pBVar16 = pBStack_58;
        value_02->clue = L"Offset To Nested Function";
        value_02->offset = 0xffffffff;
        value_02->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a2f0;
        value_02[1]._vptr_BufferBuilder = (_func_int **)builder_00;
        *(undefined4 *)&value_02[1].clue = 0;
        pIVar12 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                            (pBStack_58->list,value_02,*(ArenaAllocator **)((long)SVar17 + 0x358));
        pPVar19 = local_48;
        pBVar16->list = pIVar12;
        function_00 = FunctionInfo::GetParseableFunctionInfo(this_00);
        pFVar18 = local_50;
        AddFunction((ByteCodeBufferBuilder *)SVar17,builder_00,function_00,srcInfo,cache);
      }
      pFVar18 = (FunctionBody *)(ulong)((int)pFVar18 + 1);
    }
    pIVar12 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                        (pBStack_58->list,value_01,*(ArenaAllocator **)((long)definedFields + 0x358)
                        );
    pBVar16->list = pIVar12;
  }
  pIVar12 = regex::ImmutableList<Js::BufferBuilder_*>::ReverseCurrentList(pBVar16->list);
  pBVar16->list = pIVar12;
  PrependStruct<Js::SerializedFieldList>
            ((ByteCodeBufferBuilder *)definedFields,pBVar16,L"Serialized Field List",&local_40);
  return 0;
}

Assistant:

HRESULT AddFunction(BufferBuilderList & builder, ParseableFunctionInfo * function, SRCINFO const * srcInfo, ByteCodeCache* cache)
    {
        SerializedFieldList definedFields = { 0 };

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        PrependInt32(builder, _u("Start Function Table"), magicStartOfFunctionBody);
#endif

        uint32 sourceDiff = 0;

        if (!TryConvertToUInt32(function->StartOffset(), &sourceDiff))
        {
            Assert(0); // Likely a bug
            return ByteCodeSerializer::CantGenerate;
        }

        if (function->m_lineNumber != 0)
        {
            definedFields.has_m_lineNumber = true;
            PrependInt32(builder, _u("Line Number"), function->m_lineNumber);
        }

        if (function->m_columnNumber != 0)
        {
            definedFields.has_m_columnNumber = true;
            PrependInt32(builder, _u("Column Number"), function->m_columnNumber);
        }

        bool isAnonymous = function->GetIsAnonymousFunction();

        // FunctionBody Details
        DWORD bitFlags =
            (function->m_isDeclaration ? ffIsDeclaration : 0)
            | (function->m_hasImplicitArgIns ? ffHasImplicitArgsIn : 0)
            | (function->m_isAccessor ? ffIsAccessor : 0)
            | (function->m_isStaticNameFunction ? ffIsStaticNameFunction : 0)
            | (function->m_isNamedFunctionExpression ? ffIsNamedFunctionExpression : 0)
            | (function->m_isNameIdentifierRef ? ffIsNameIdentifierRef : 0)
            | (function->m_isGlobalFunc ? ffIsGlobalFunc : 0)
            | (function->m_dontInline ? ffDontInline : 0)
            | (function->m_isStrictMode ? ffIsStrictMode : 0)
            | (function->m_doBackendArgumentsOptimization ? ffDoBackendArgumentsOptimization : 0)
            | (function->m_doScopeObjectCreation ? ffDoScopeObjectCreation : 0)
            | (function->m_usesArgumentsObject ? ffUsesArgumentsObject : 0)
            | (function->m_isEval ? ffIsEval : 0)
            | (function->m_isDynamicFunction ? ffIsDynamicFunction : 0)
            | (isAnonymous ? ffIsAnonymous : 0)
            | (function->m_isMethod ? ffIsMethod : 0)
            | (function->m_isClassMember ? ffIsClassMember : 0)
#ifdef ASMJS_PLAT
            | (function->m_isAsmjsMode ? ffIsAsmJsMode : 0)
            | (function->m_isAsmJsFunction ? ffIsAsmJsFunction : 0)
#endif
            ;

        FunctionBody *functionBody = nullptr;
        if (function->IsFunctionBody())
        {
            functionBody = function->GetFunctionBody();

            bitFlags |=
                (functionBody->m_isFuncRegistered ? ffIsFuncRegistered : 0)
                | (functionBody->m_hasAllNonLocalReferenced ? ffhasAllNonLocalReferenced : 0)
                | (functionBody->m_hasSetIsObject ? ffhasSetIsObject : 0)
                | (functionBody->m_CallsEval ? ffhasSetCallsEval : 0)
                | (functionBody->m_ChildCallsEval ? ffChildCallsEval : 0)
                | (functionBody->m_hasReferenceableBuiltInArguments ? ffHasReferenceableBuiltInArguments : 0)
                | (functionBody->m_isParamAndBodyScopeMerged ? ffIsParamAndBodyScopeMerged : 0);
        }

        PrependConstantInt32(builder, _u("BitFlags"), bitFlags);

        if (!isAnonymous)
        {
            const char16* displayName = function->GetDisplayName();
            uint displayNameLength = function->m_displayNameLength;
            PrependString16(builder, _u("Display Name"), displayName, (displayNameLength + 1) * sizeof(char16));
        }

        PrependInt32(builder, _u("Relative Function ID"), function->GetLocalFunctionId() - topFunctionId); // Serialized function ids are relative to the top function ID
        auto attributes = function->GetAttributes();
        AssertMsg((attributes &
            ~(FunctionInfo::Attributes::ErrorOnNew
                | FunctionInfo::Attributes::SuperReference
                | FunctionInfo::Attributes::Lambda
                | FunctionInfo::Attributes::Async
                | FunctionInfo::Attributes::CapturesThis
                | FunctionInfo::Attributes::Generator
                | FunctionInfo::Attributes::ClassConstructor
                | FunctionInfo::Attributes::BaseConstructorKind
                | FunctionInfo::Attributes::ClassMethod
                | FunctionInfo::Attributes::Method
                | FunctionInfo::Attributes::EnclosedByGlobalFunc
                | FunctionInfo::Attributes::AllowDirectSuper
                | FunctionInfo::Attributes::DeferredParse
                | FunctionInfo::Attributes::CanDefer
                | FunctionInfo::Attributes::ComputedName
                | FunctionInfo::Attributes::HomeObj)) == 0,
            "Only the ErrorOnNew|SuperReference|Lambda|CapturesThis|Generator|ClassConstructor|BaseConstructorKind|Async|ClassMember|Method|EnclosedByGlobalFunc|AllowDirectSuper|ComputedName|DeferredParse|CanDefer|HomeObj attributes should be set on a serialized function");
        if (attributes != FunctionInfo::Attributes::None)
        {
            definedFields.has_attributes = true;
            PrependInt32(builder, _u("Attributes"), attributes);
        }

        PrependInt32(builder, _u("Offset Into Source"), sourceDiff);
        PrependInt32(builder, _u("Offset Into Source for toString"), function->PrintableStartOffset());
        if (function->GetNestedCount() > 0)
        {
            definedFields.has_m_nestedCount = true;
            PrependInt32(builder, _u("Nested count"), function->GetNestedCount());
        }

        DeferredFunctionStub* deferredStubs = function->GetDeferredStubs();
        if (deferredStubs != nullptr
            && (attributes & FunctionInfo::Attributes::DeferredParse) != 0
            && GenerateParserStateCache())
        {
            definedFields.has_deferredStubs = true;
            AddDeferredStubs(builder, deferredStubs, function->GetNestedCount(), cache, true);
        }

        PrintOffsets* printOffsets = function->GetPrintOffsets();
        if (printOffsets != nullptr)
        {
            definedFields.has_printOffsets = true;
            PrependInt32(builder, _u("Start print offset"), printOffsets->cbStartPrintOffset);
            PrependInt32(builder, _u("End print offset"), printOffsets->cbEndPrintOffset);
        }

        ScopeInfo* scopeInfo = function->GetScopeInfo();
        if (scopeInfo != nullptr
            && (attributes & (FunctionInfo::Attributes::DeferredParse | FunctionInfo::Attributes::CanDefer)) != 0)
        {
            definedFields.has_scopeInfo = true;
            AddScopeInfo(builder, scopeInfo);
        }

#define PrependArgSlot PrependInt16
#define PrependRegSlot PrependInt32
#define PrependCharCount PrependInt32
#define PrependULong PrependInt32
#define PrependUInt16 PrependInt16
#define PrependUInt32 PrependInt32

#define DEFINE_FUNCTION_PROXY_FIELDS 1
#define DEFINE_PARSEABLE_FUNCTION_INFO_FIELDS 1
#define DECLARE_SERIALIZABLE_FIELD(type, name, serializableType) \
        if (function->##name != 0) { \
            definedFields.has_##name = true; \
            Prepend##serializableType(builder, _u(#name), function->##name); \
        }

#include "SerializableFunctionFields.h"

        AddPropertyIdsForScopeSlotArray(builder, function);

        if (functionBody != nullptr)
        {
            AddFunctionBody(builder, functionBody, srcInfo, definedFields);
        }

        // Lastly, write each of the lexically enclosed functions
        if (function->GetNestedCount())
        {
            auto nestedBodyList = Anew(alloc, BufferBuilderList, _u("Nest Function Bodies"));

            for (uint32 i = 0; i < function->GetNestedCount(); ++i)
            {
                auto nestedFunction = function->GetNestedFunc(i);
                if (nestedFunction == nullptr || !nestedFunction->HasParseableInfo())
                {
                    PrependConstantInt32(builder, _u("Empty Nested Function"), 0);
                }
                else
                {
                    auto nestedFunctionBuilder = Anew(alloc, BufferBuilderList, _u("Nested Function"));
                    nestedBodyList->list = nestedBodyList->list->Prepend(nestedFunctionBuilder, alloc);
                    auto offsetToNested = Anew(alloc, BufferBuilderRelativeOffset, _u("Offset To Nested Function"), nestedFunctionBuilder);
                    builder.list = builder.list->Prepend(offsetToNested, alloc);
                    AddFunction(*nestedFunctionBuilder, nestedFunction->GetParseableFunctionInfo(), srcInfo, cache);
                }
            }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
            PrependInt32(builder, _u("End Function Body"), magicEndOfFunctionBody);
#endif

            builder.list = builder.list->Prepend(nestedBodyList, alloc);
        }
        else
        {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
            PrependInt32(builder, _u("End Function Body"), magicEndOfFunctionBody);
#endif
        }

        // Reverse to put prepended items in correct order
        builder.list = builder.list->ReverseCurrentList();
        PrependStruct<SerializedFieldList>(builder, _u("Serialized Field List"), &definedFields);

        return S_OK;
    }